

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O0

void __thiscall CatalogReader::CatalogReader(CatalogReader *this,AbstractMajor *major)

{
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  AbstractMajor *local_18;
  AbstractMajor *major_local;
  CatalogReader *this_local;
  
  local_18 = major;
  major_local = (AbstractMajor *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->resourcesPath,"resources/courses",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->resourceExtension,".txt",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->beginDebugString,"|-- START --- CATALOGREADER --- DEBUG --|",&local_2e
            );
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->endDebugString,"|---------------------------------------|",&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  this->major = local_18;
  this->debugOn = false;
  return;
}

Assistant:

CatalogReader(AbstractMajor* major) {
			this->major = major;
			this->debugOn = false;
		}